

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_create_table.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::DuckCatalog::PlanCreateTableAs
          (DuckCatalog *this,ClientContext *context,PhysicalPlanGenerator *planner,
          LogicalCreateTable *op,PhysicalOperator *plan)

{
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  TaskScheduler *this_00;
  PhysicalOperator *pPVar4;
  bool parallel;
  bool local_39;
  reference_wrapper<duckdb::PhysicalOperator> local_38;
  
  bVar1 = PhysicalPlanGenerator::PreserveInsertionOrder(context,plan);
  bVar2 = PhysicalPlanGenerator::UseBatchIndex(context,plan);
  this_00 = TaskScheduler::GetScheduler(context);
  iVar3 = TaskScheduler::NumberOfThreads(this_00);
  if ((bVar1) && (bVar2)) {
    local_38._M_data = (PhysicalOperator *)((ulong)local_38._M_data._4_4_ << 0x20);
    pPVar4 = PhysicalPlanGenerator::
             Make<duckdb::PhysicalBatchInsert,duckdb::LogicalCreateTable&,duckdb::SchemaCatalogEntry&,duckdb::unique_ptr<duckdb::BoundCreateTableInfo,std::default_delete<duckdb::BoundCreateTableInfo>,true>,unsigned_int>
                       (planner,op,op->schema,&op->info,(uint *)&local_38);
  }
  else {
    local_39 = 1 < iVar3 && !bVar1;
    local_38._M_data = (PhysicalOperator *)((ulong)local_38._M_data._4_4_ << 0x20);
    pPVar4 = PhysicalPlanGenerator::
             Make<duckdb::PhysicalInsert,duckdb::LogicalCreateTable&,duckdb::SchemaCatalogEntry&,duckdb::unique_ptr<duckdb::BoundCreateTableInfo,std::default_delete<duckdb::BoundCreateTableInfo>,true>,unsigned_int,bool&>
                       (planner,op,op->schema,&op->info,(uint *)&local_38,&local_39);
  }
  local_38._M_data = plan;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&pPVar4->children,&local_38);
  return pPVar4;
}

Assistant:

PhysicalOperator &DuckCatalog::PlanCreateTableAs(ClientContext &context, PhysicalPlanGenerator &planner,
                                                 LogicalCreateTable &op, PhysicalOperator &plan) {
	bool parallel_streaming_insert = !PhysicalPlanGenerator::PreserveInsertionOrder(context, plan);
	bool use_batch_index = PhysicalPlanGenerator::UseBatchIndex(context, plan);
	auto num_threads = TaskScheduler::GetScheduler(context).NumberOfThreads();
	if (!parallel_streaming_insert && use_batch_index) {
		auto &insert = planner.Make<PhysicalBatchInsert>(op, op.schema, std::move(op.info), 0U);
		D_ASSERT(op.children.size() == 1);
		insert.children.push_back(plan);
		return insert;
	}

	auto parallel = parallel_streaming_insert && num_threads > 1;
	auto &insert = planner.Make<PhysicalInsert>(op, op.schema, std::move(op.info), 0U, parallel);
	D_ASSERT(op.children.size() == 1);
	insert.children.push_back(plan);
	return insert;
}